

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

RepeatedField<double> *
google::protobuf::Arena::CreateArenaCompatible<google::protobuf::RepeatedField<double>>
          (Arena *arena)

{
  RepeatedField<double> *pRVar1;
  
  if (arena != (Arena *)0x0) {
    pRVar1 = DoCreateMessage<google::protobuf::RepeatedField<double>>(arena);
    return pRVar1;
  }
  pRVar1 = (RepeatedField<double> *)operator_new(0x10);
  RepeatedField<double>::RepeatedField(pRVar1,(Arena *)0x0);
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateArenaCompatible(Arena* arena) {
    static_assert(is_arena_constructable<T>::value,
                  "Can only construct types that are ArenaConstructable");
    if (PROTOBUF_PREDICT_FALSE(arena == nullptr)) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }